

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_things.cpp
# Opt level: O0

void swrenderer::R_SortVisSprites(_func_bool_vissprite_t_ptr_vissprite_t_ptr *compare,size_t first)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  undefined8 *local_28;
  vissprite_t **spr;
  int i;
  size_t first_local;
  _func_bool_vissprite_t_ptr_vissprite_t_ptr *compare_local;
  
  vsprcount = (int)((long)(vissprite_p - (vissprites + first * 8)) >> 3);
  if (vsprcount != 0) {
    if (spritesortersize < MaxVisSprites) {
      if ((spritesorter != (vissprite_t **)0x0) && (spritesorter != (vissprite_t **)0x0)) {
        operator_delete__(spritesorter);
      }
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)MaxVisSprites;
      uVar2 = SUB168(auVar1 * ZEXT816(8),0);
      if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
        uVar2 = 0xffffffffffffffff;
      }
      spritesorter = (vissprite_t **)operator_new__(uVar2);
      spritesortersize = MaxVisSprites;
    }
    if ((i_compatflags & 0x8000000U) == 0) {
      local_28 = firstvissprite;
      for (spr._4_4_ = 0; spr._4_4_ < vsprcount; spr._4_4_ = spr._4_4_ + 1) {
        spritesorter[spr._4_4_] = (vissprite_t *)*local_28;
        local_28 = local_28 + 1;
      }
    }
    else {
      local_28 = firstvissprite + vsprcount;
      for (spr._4_4_ = 0; local_28 = local_28 + -1, spr._4_4_ < vsprcount; spr._4_4_ = spr._4_4_ + 1
          ) {
        spritesorter[spr._4_4_] = (vissprite_t *)*local_28;
      }
    }
    std::
    stable_sort<swrenderer::vissprite_t**,bool(*)(swrenderer::vissprite_t*,swrenderer::vissprite_t*)>
              (spritesorter,spritesorter + vsprcount,compare);
  }
  return;
}

Assistant:

void R_SortVisSprites (bool (*compare)(vissprite_t *, vissprite_t *), size_t first)
{
	int i;
	vissprite_t **spr;

	vsprcount = int(vissprite_p - &vissprites[first]);

	if (vsprcount == 0)
		return;

	if (spritesortersize < MaxVisSprites)
	{
		if (spritesorter != NULL)
			delete[] spritesorter;
		spritesorter = new vissprite_t *[MaxVisSprites];
		spritesortersize = MaxVisSprites;
	}

	if (!(i_compatflags & COMPATF_SPRITESORT))
	{
		for (i = 0, spr = firstvissprite; i < vsprcount; i++, spr++)
		{
			spritesorter[i] = *spr;
		}
	}
	else
	{
		// If the compatibility option is on sprites of equal distance need to
		// be sorted in inverse order. This is most easily achieved by
		// filling the sort array backwards before the sort.
		for (i = 0, spr = firstvissprite + vsprcount-1; i < vsprcount; i++, spr--)
		{
			spritesorter[i] = *spr;
		}
	}

	std::stable_sort(&spritesorter[0], &spritesorter[vsprcount], compare);
}